

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall
cmTarget::SetLanguageStandardProperty(cmTarget *this,string *lang,string *value,string *feature)

{
  pointer pBVar1;
  pointer __s2;
  size_t sVar2;
  int iVar3;
  mapped_type *pmVar4;
  pointer pBVar5;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var6;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmListFileBacktrace featureBacktrace;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_98;
  cmTarget *local_88;
  string local_80;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_60;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_98);
  _Var6._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  pBVar5 = *(pointer *)
            &(((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)&(_Var6._M_head_impl)->CompileFeatures + 0x18))->
             super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl;
  pBVar1 = *(pointer *)((long)&(_Var6._M_head_impl)->CompileFeatures + 0x20);
  local_88 = this;
  if (pBVar5 != pBVar1) {
    __s2 = (feature->_M_dataplus)._M_p;
    sVar2 = feature->_M_string_length;
    do {
      if (((pBVar5->Value)._M_string_length == sVar2) &&
         ((sVar2 == 0 || (iVar3 = bcmp((pBVar5->Value)._M_dataplus._M_p,__s2,sVar2), iVar3 == 0))))
      {
        local_98.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (pBVar5->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                  TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_98.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&(pBVar5->Backtrace).
                           super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry + 8))
        ;
        _Var6._M_head_impl =
             (local_88->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
        break;
      }
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar1);
  }
  local_60.first._M_str = (lang->_M_dataplus)._M_p;
  local_60.first._M_len = lang->_M_string_length;
  local_60.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_48 = 9;
  local_40 = "_STANDARD";
  local_38 = 0;
  views._M_len = 2;
  views._M_array = &local_60;
  cmCatViews(&local_80,views);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[](&(_Var6._M_head_impl)->LanguageStandardProperties,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  sVar2 = (pmVar4->Value)._M_string_length;
  if ((sVar2 != value->_M_string_length) ||
     ((sVar2 != 0 &&
      (iVar3 = bcmp((pmVar4->Value)._M_dataplus._M_p,(value->_M_dataplus)._M_p,sVar2), iVar3 != 0)))
     ) {
    std::__cxx11::string::_M_assign((string *)pmVar4);
    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
              (&pmVar4->Backtraces);
  }
  std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
  emplace_back<cmListFileBacktrace&>
            ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)&pmVar4->Backtraces,
             (cmListFileBacktrace *)&local_98);
  if (local_98.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void cmTarget::SetLanguageStandardProperty(std::string const& lang,
                                           std::string const& value,
                                           const std::string& feature)
{
  cmListFileBacktrace featureBacktrace;
  for (auto const& entry : this->impl->CompileFeatures.Entries) {
    if (entry.Value == feature) {
      featureBacktrace = entry.Backtrace;
      break;
    }
  }

  BTs<std::string>& languageStandardProperty =
    this->impl->LanguageStandardProperties[cmStrCat(lang, "_STANDARD")];
  if (languageStandardProperty.Value != value) {
    languageStandardProperty.Value = value;
    languageStandardProperty.Backtraces.clear();
  }
  languageStandardProperty.Backtraces.emplace_back(featureBacktrace);
}